

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_unlk(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  uint uVar1;
  TCGContext_conflict2 *s_00;
  TCGv_i32 pTVar2;
  TCGContext_conflict2 *s_01;
  TCGTemp *pTVar3;
  TCGv_i32 *ppTVar4;
  TCGv_i32 addr;
  uintptr_t o_2;
  TCGv_i32 val;
  uintptr_t o;
  uintptr_t o_3;
  
  s_00 = s->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  addr = (TCGv_i32)((long)pTVar3 - (long)s_00);
  if (((uint)s->writeback_mask >> (insn & 7) & 1) == 0) {
    ppTVar4 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar4 = s->writeback;
  }
  pTVar2 = ppTVar4[insn & 7];
  if (pTVar2 != addr) {
    tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)pTVar3,(TCGArg)(pTVar2 + (long)&s_00->pool_cur));
  }
  uVar1 = ((s->base).tb)->flags;
  s_01 = s->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_m68k(s_01,TCG_TYPE_I32,false);
  val = (TCGv_i32)((long)pTVar3 - (long)s_01);
  tcg_gen_qemu_ld_i32_m68k(s_01,val,addr,(ulong)((uVar1 >> 0xd & 1) == 0),MO_BEUL);
  if (pTVar2 != val) {
    tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)(pTVar2 + (long)s_00),
                     (TCGArg)((long)s_00 + (long)val));
  }
  if ((s->writeback_mask & 0x80) == 0) {
    ppTVar4 = s->uc->tcg_ctx->cpu_aregs;
  }
  else {
    ppTVar4 = s->writeback;
  }
  tcg_gen_addi_i32_m68k(s_00,ppTVar4[7],addr,4);
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(addr + (long)s_00));
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(val + (long)s_00));
  return;
}

Assistant:

DISAS_INSN(unlk)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv reg;
    TCGv tmp;

    src = tcg_temp_new(tcg_ctx);
    reg = AREG(insn, 0);
    tcg_gen_mov_i32(tcg_ctx, src, reg);
    tmp = gen_load(s, OS_LONG, src, 0, IS_USER(s));
    tcg_gen_mov_i32(tcg_ctx, reg, tmp);
    tcg_gen_addi_i32(tcg_ctx, QREG_SP, src, 4);
    tcg_temp_free(tcg_ctx, src);
    tcg_temp_free(tcg_ctx, tmp);
}